

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void andres::marray_detail::
     OperateHelperUnary<(unsigned_short)4,_andres::marray_detail::PrefixIncrement<int>,_int,_std::allocator<unsigned_long>_>
     ::operate(View<int,_false,_std::allocator<unsigned_long>_> *v,long param_2)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,3);
  if (sVar1 != 0) {
    uVar2 = 0;
    do {
      sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,2);
      if (sVar1 != 0) {
        uVar3 = 0;
        lVar4 = param_2;
        do {
          OperateHelperUnary<(unsigned_short)2,_andres::marray_detail::PrefixIncrement<int>,_int,_std::allocator<unsigned_long>_>
          ::operate(v,lVar4);
          sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,2);
          lVar4 = lVar4 + sVar1 * 4;
          uVar3 = uVar3 + 1;
          sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,2);
        } while (uVar3 < sVar1);
      }
      View<int,_false,_std::allocator<unsigned_long>_>::shape(v,2);
      View<int,_false,_std::allocator<unsigned_long>_>::strides(v,2);
      sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,3);
      param_2 = param_2 + sVar1 * 4;
      uVar2 = uVar2 + 1;
      sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,3);
    } while (uVar2 < sVar1);
  }
  View<int,_false,_std::allocator<unsigned_long>_>::shape(v,3);
  View<int,_false,_std::allocator<unsigned_long>_>::strides(v,3);
  return;
}

Assistant:

static inline void operate
    (
        View<T, false, A>& v, 
        Functor f, 
        T* data
    )
    {
        for(std::size_t j=0; j<v.shape(N-1); ++j) {
            OperateHelperUnary<N-1, Functor, T, A>::operate(v, f, data);
            data += v.strides(N-1);
        }
        data -= v.shape(N-1) * v.strides(N-1);
    }